

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

size_t cppwinrt::get_fastabi_size
                 (writer *w,
                 vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *classes)

{
  bool bVar1;
  unsigned_long *puVar2;
  size_t local_48;
  reference local_40;
  TypeDef *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range1;
  size_t result;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *classes_local;
  writer *w_local;
  
  __range1 = (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)0x0;
  result = (size_t)classes;
  classes_local = (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)w;
  __end1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                     (classes);
  type = (TypeDef *)
         std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end(classes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                                *)&type);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
               ::operator*(&__end1);
    local_48 = get_fastabi_size((writer *)classes_local,local_40);
    puVar2 = std::max<unsigned_long>((unsigned_long *)&__range1,&local_48);
    __range1 = (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)*puVar2;
    __gnu_cxx::
    __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
    ::operator++(&__end1);
  }
  return (size_t)__range1;
}

Assistant:

auto get_fastabi_size(writer& w, std::vector<TypeDef> const& classes)
    {
        std::size_t result{};

        for (auto&& type : classes)
        {
            result = (std::max)(result, get_fastabi_size(w, type));
        }

        return result;
    }